

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_append_filter.c
# Opt level: O2

int archive_read_append_filter(archive *_a,int code)

{
  int iVar1;
  void *pvVar2;
  char *pcVar3;
  long lVar4;
  char str [20];
  int *local_38;
  
  switch(code) {
  case 0:
    goto switchD_0012153e_caseD_0;
  case 1:
    builtin_strncpy(str,"gzip",5);
    code = archive_read_support_filter_gzip(_a);
    break;
  case 2:
    builtin_strncpy(str,"bzip2",6);
    code = archive_read_support_filter_bzip2(_a);
    break;
  case 3:
    builtin_strncpy(str + 8," (.Z)",6);
    builtin_strncpy(str,"compress",8);
    code = archive_read_support_filter_compress(_a);
    break;
  case 4:
    pcVar3 = "Cannot append program filter using archive_read_append_filter";
    goto LAB_001216df;
  case 5:
    builtin_strncpy(str,"lzma",5);
    code = archive_read_support_filter_lzma(_a);
    break;
  case 6:
    str[2] = '\0';
    str[0] = 'x';
    str[1] = 'z';
    code = archive_read_support_filter_xz(_a);
    break;
  case 7:
    str[2] = '\0';
    str[0] = 'u';
    str[1] = 'u';
    code = archive_read_support_filter_uu(_a);
    break;
  case 8:
    builtin_strncpy(str,"rpm",4);
    code = archive_read_support_filter_rpm(_a);
    break;
  case 9:
    builtin_strncpy(str,"lzip",5);
    code = archive_read_support_filter_lzip(_a);
    break;
  case 10:
    builtin_strncpy(str,"lrzip",6);
    code = archive_read_support_filter_lrzip(_a);
    break;
  case 0xb:
    builtin_strncpy(str,"lzop",5);
    code = archive_read_support_filter_lzop(_a);
    break;
  default:
    pcVar3 = "Invalid filter code specified";
    goto LAB_001216df;
  case 0xd:
    builtin_strncpy(str,"lz4",4);
    code = archive_read_support_filter_lz4(_a);
    break;
  case 0xe:
    builtin_strncpy(str,"zstd",5);
    code = archive_read_support_filter_zstd(_a);
  }
  local_38 = &_a[4].file_count;
  for (lVar4 = 0; (int)lVar4 != 0x168; lVar4 = lVar4 + 0x18) {
    pcVar3 = *(char **)((long)&_a[1].read_data_output_offset + lVar4);
    if (pcVar3 == (char *)0x0) goto LAB_001216d8;
    iVar1 = strcmp(pcVar3,str);
    if (iVar1 == 0) {
      local_38 = (int *)((long)&_a[1].read_data_offset + lVar4);
      goto LAB_001216c9;
    }
  }
  pcVar3 = _a[4].error;
  if (pcVar3 != (char *)0x0) {
LAB_001216c9:
    iVar1 = strcmp(pcVar3,str);
    if (iVar1 == 0) {
      pvVar2 = calloc(1,0x90);
      if (pvVar2 != (void *)0x0) {
        *(int **)((long)pvVar2 + 8) = local_38;
        *(archive **)((long)pvVar2 + 0x18) = _a;
        *(size_t *)((long)pvVar2 + 0x10) = _a[4].error_string.length;
        _a[4].error_string.length = (size_t)pvVar2;
        iVar1 = (**(code **)(((archive_string *)(local_38 + 4))->s + 8))(pvVar2);
        if (iVar1 != 0) {
          __archive_read_free_filters((archive_read *)_a);
          return -0x1e;
        }
switchD_0012153e_caseD_0:
        *(undefined4 *)&_a[4].error_string.buffer_length = 1;
        return code >> 0x1f & code;
      }
      pcVar3 = "Out of memory";
      iVar1 = 0xc;
      goto LAB_001216e1;
    }
  }
LAB_001216d8:
  pcVar3 = "Internal error: Unable to append filter";
LAB_001216df:
  iVar1 = 0x16;
LAB_001216e1:
  archive_set_error(_a,iVar1,pcVar3);
  return -0x1e;
}

Assistant:

int
archive_read_append_filter(struct archive *_a, int code)
{
  int r1, r2, number_bidders, i;
  char str[20];
  struct archive_read_filter_bidder *bidder;
  struct archive_read_filter *filter;
  struct archive_read *a = (struct archive_read *)_a;

  r2 = (ARCHIVE_OK);
  switch (code)
  {
    case ARCHIVE_FILTER_NONE:
      /* No filter to add, so do nothing.
       * NOTE: An initial "NONE" type filter is always set at the end of the
       * filter chain.
       */
      r1 = (ARCHIVE_OK);
      break;
    case ARCHIVE_FILTER_GZIP:
      strcpy(str, "gzip");
      r1 = archive_read_support_filter_gzip(_a);
      break;
    case ARCHIVE_FILTER_BZIP2:
      strcpy(str, "bzip2");
      r1 = archive_read_support_filter_bzip2(_a);
      break;
    case ARCHIVE_FILTER_COMPRESS:
      strcpy(str, "compress (.Z)");
      r1 = archive_read_support_filter_compress(_a);
      break;
    case ARCHIVE_FILTER_PROGRAM:
      archive_set_error(&a->archive, ARCHIVE_ERRNO_PROGRAMMER,
          "Cannot append program filter using archive_read_append_filter");
      return (ARCHIVE_FATAL);
    case ARCHIVE_FILTER_LZMA:
      strcpy(str, "lzma");
      r1 = archive_read_support_filter_lzma(_a);
      break;
    case ARCHIVE_FILTER_XZ:
      strcpy(str, "xz");
      r1 = archive_read_support_filter_xz(_a);
      break;
    case ARCHIVE_FILTER_UU:
      strcpy(str, "uu");
      r1 = archive_read_support_filter_uu(_a);
      break;
    case ARCHIVE_FILTER_RPM:
      strcpy(str, "rpm");
      r1 = archive_read_support_filter_rpm(_a);
      break;
    case ARCHIVE_FILTER_LZ4:
      strcpy(str, "lz4");
      r1 = archive_read_support_filter_lz4(_a);
      break;
    case ARCHIVE_FILTER_ZSTD:
      strcpy(str, "zstd");
      r1 = archive_read_support_filter_zstd(_a);
      break;
    case ARCHIVE_FILTER_LZIP:
      strcpy(str, "lzip");
      r1 = archive_read_support_filter_lzip(_a);
      break;
    case ARCHIVE_FILTER_LZOP:
      strcpy(str, "lzop");
      r1 = archive_read_support_filter_lzop(_a);
      break;
    case ARCHIVE_FILTER_LRZIP:
      strcpy(str, "lrzip");
      r1 = archive_read_support_filter_lrzip(_a);
      break;
    default:
      archive_set_error(&a->archive, ARCHIVE_ERRNO_PROGRAMMER,
          "Invalid filter code specified");
      return (ARCHIVE_FATAL);
  }

  if (code != ARCHIVE_FILTER_NONE)
  {
    number_bidders = sizeof(a->bidders) / sizeof(a->bidders[0]);

    bidder = a->bidders;
    for (i = 1; i < number_bidders; i++, bidder++)
    {
      if (!bidder->name || !strcmp(bidder->name, str))
        break;
    }
    if (!bidder->name || strcmp(bidder->name, str))
    {
      archive_set_error(&a->archive, ARCHIVE_ERRNO_PROGRAMMER,
          "Internal error: Unable to append filter");
      return (ARCHIVE_FATAL);
    }

    filter = calloc(1, sizeof(*filter));
    if (filter == NULL)
    {
      archive_set_error(&a->archive, ENOMEM, "Out of memory");
      return (ARCHIVE_FATAL);
    }
    filter->bidder = bidder;
    filter->archive = a;
    filter->upstream = a->filter;
    a->filter = filter;
    r2 = (bidder->vtable->init)(a->filter);
    if (r2 != ARCHIVE_OK) {
      __archive_read_free_filters(a);
      return (ARCHIVE_FATAL);
    }
  }

  a->bypass_filter_bidding = 1;
  return (r1 < r2) ? r1 : r2;
}